

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

uint FSE_optimalTableLog_internal(uint maxTableLog,size_t srcSize,uint maxSymbolValue,uint minus)

{
  uint uVar1;
  uint uVar2;
  undefined4 local_28;
  U32 minBits;
  U32 tableLog;
  U32 maxBitsSrc;
  uint minus_local;
  uint maxSymbolValue_local;
  size_t srcSize_local;
  uint maxTableLog_local;
  
  uVar1 = BIT_highbit32((int)srcSize - 1);
  uVar2 = FSE_minTableLog(srcSize,maxSymbolValue);
  local_28 = maxTableLog;
  if (maxTableLog == 0) {
    local_28 = 0xb;
  }
  if (uVar1 - minus < local_28) {
    local_28 = uVar1 - minus;
  }
  if (local_28 < uVar2) {
    local_28 = uVar2;
  }
  if (local_28 < 5) {
    local_28 = 5;
  }
  if (0xc < local_28) {
    local_28 = 0xc;
  }
  return local_28;
}

Assistant:

unsigned FSE_optimalTableLog_internal(unsigned maxTableLog, size_t srcSize, unsigned maxSymbolValue, unsigned minus)
{
    U32 maxBitsSrc = BIT_highbit32((U32)(srcSize - 1)) - minus;
    U32 tableLog = maxTableLog;
    U32 minBits = FSE_minTableLog(srcSize, maxSymbolValue);
    assert(srcSize > 1); /* Not supported, RLE should be used instead */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (maxBitsSrc < tableLog) tableLog = maxBitsSrc;   /* Accuracy can be reduced */
    if (minBits > tableLog) tableLog = minBits;   /* Need a minimum to safely represent all symbol values */
    if (tableLog < FSE_MIN_TABLELOG) tableLog = FSE_MIN_TABLELOG;
    if (tableLog > FSE_MAX_TABLELOG) tableLog = FSE_MAX_TABLELOG;
    return tableLog;
}